

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

bool ot::commissioner::utils::CaseInsensitiveEqual(string *aLhs,string *aRhs)

{
  __type_conflict1 _Var1;
  string sStack_58;
  string local_38;
  
  ToLower(&sStack_58,aLhs);
  ToLower(&local_38,aRhs);
  _Var1 = std::operator==(&sStack_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return _Var1;
}

Assistant:

bool CaseInsensitiveEqual(const std::string &aLhs, const std::string &aRhs)
{
    return ToLower(aLhs) == ToLower(aRhs);
}